

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

void __thiscall
andyzip::brotli_decoder::read_huffman_code<andyzip::huffman_table<258>>
          (brotli_decoder *this,brotli_decoder_state *s,huffman_table<258> *table,int alphabet_size)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  pair<unsigned_int,_unsigned_int> pVar10;
  undefined4 in_register_0000000c;
  size_t __nbytes;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  uint local_454;
  int local_440;
  int local_43c;
  int j;
  int old_repeat;
  int repeat_delta;
  int new_len;
  int extra_bits;
  int code_len;
  pair<unsigned_int,_unsigned_int> code;
  int i_2;
  int repeat_code_len;
  int repeat;
  int prev_code_len;
  uint8_t nzcl;
  uint8_t lengths_1 [258];
  int space_1;
  int iStack_2f4;
  uint8_t length;
  int bits;
  int i_1;
  int num_codes;
  int space;
  uint8_t lengths [18];
  huffman_table<18> complex_table;
  int tree_select;
  int i;
  uint16_t symbols [258];
  int alphabet_bits;
  int num_symbols;
  int code_type;
  int alphabet_size_local;
  huffman_table<258> *table_local;
  brotli_decoder_state *s_local;
  uint code_1;
  uint offset;
  uint length_1;
  uint index;
  uint value;
  pair<unsigned_int,_unsigned_int> local_10;
  
  __nbytes = CONCAT44(in_register_0000000c,alphabet_size);
  sVar8 = brotli_decoder_state::read((brotli_decoder_state *)this,2,table,__nbytes);
  iStack_2f4 = (int)sVar8;
  if (*(int *)(this + 0x28) == 0) {
    uVar4 = (uint)table & 0x3ff;
    if (iStack_2f4 == 1) {
      sVar8 = brotli_decoder_state::read((brotli_decoder_state *)this,2,__buf,__nbytes);
      iVar5 = (int)sVar8 + 1;
      symbols._512_4_ = log2_floor(uVar4 - 1);
      complex_table.base_[0x11] = 0;
      complex_table.invalid_ = false;
      complex_table._111_1_ = 0;
      __buf_00 = extraout_RDX;
      for (; complex_table._108_4_ != iVar5; complex_table._108_4_ = complex_table._108_4_ + 1) {
        sVar9 = brotli_decoder_state::read
                          ((brotli_decoder_state *)this,symbols._512_4_,__buf_00,__nbytes);
        __nbytes = CONCAT62((int6)(__nbytes >> 0x10),(short)sVar9);
        *(short *)((long)&tree_select + (long)(int)complex_table._108_4_ * 2) = (short)sVar9;
        __buf_00 = extraout_RDX_00;
      }
      if (iVar5 == 4) {
        sVar9 = brotli_decoder_state::read((brotli_decoder_state *)this,1,__buf_00,__nbytes);
        local_440 = (int)sVar9;
      }
      else {
        local_440 = 0;
      }
      huffman_table<258>::init
                ((huffman_table<258> *)s,
                 (EVP_PKEY_CTX *)
                 (read_huffman_code<andyzip::huffman_table<258>_>::simple_lengths +
                 ((int)sVar8 + local_440)));
    }
    else {
      memset(&num_codes,0,0x12);
      i_1 = 0;
      bits = 0;
      for (; iStack_2f4 != 0x12; iStack_2f4 = iStack_2f4 + 1) {
        iVar5 = brotli_decoder_state::peek((brotli_decoder_state *)this,4);
        if (*(int *)(this + 0x28) != 0) {
          return;
        }
        brotli_decoder_state::drop
                  ((brotli_decoder_state *)this,
                   (uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[iVar5]);
        bVar1 = ""[iVar5];
        *(byte *)((long)&num_codes + (ulong)"\x01\x02\x03\x04"[iStack_2f4]) = bVar1;
        if (bVar1 != 0) {
          bits = bits + 1;
          i_1 = (0x20 >> (bVar1 & 0x1f)) + i_1;
          if (0x1f < i_1) break;
        }
      }
      if ((bits == 1) || (i_1 == 0x20)) {
        huffman_table<18>::init((huffman_table<18> *)(lengths + 0x10),(EVP_PKEY_CTX *)&num_codes);
        bVar2 = huffman_table<18>::invalid((huffman_table<18> *)(lengths + 0x10));
        if (bVar2) {
          *(undefined4 *)(this + 0x28) = 4;
        }
        else {
          stack0xfffffffffffffd00 = 0;
          repeat_code_len = 8;
          i_2 = 0;
          code.second = 0;
          code.first = 0;
          while ((int)code.first < (int)uVar4 && stack0xfffffffffffffd00 < 0x8000) {
            index = brotli_decoder_state::peek((brotli_decoder_state *)this,0x10);
            _value = lengths + 0x10;
            uVar3 = rev16((uint16_t)index);
            length_1 = (uint)uVar3;
            offset = 0;
            while (complex_table.symbols_[(ulong)offset + 0xe] < length_1) {
              offset = offset + 1;
            }
            code_1 = lengths[0x10] + offset;
            s_local._4_4_ = (uint)(uVar3 >> (0x10U - (char)code_1 & 0x1f));
            s_local._0_4_ =
                 (uint)complex_table.symbols_
                       [(ulong)(s_local._4_4_ - complex_table.limits_[(ulong)offset + 0xe]) - 4];
            pVar10 = std::make_pair<unsigned_int&,unsigned_int&>(&code_1,(uint *)&s_local);
            extra_bits = pVar10.first;
            local_10 = pVar10;
            brotli_decoder_state::drop((brotli_decoder_state *)this,extra_bits);
            code_len = pVar10.second;
            if (code_len < 0x10) {
              if ((int)uVar4 < (int)(code.first + 1)) {
                *(undefined4 *)(this + 0x28) = 4;
                return;
              }
              *(byte *)((long)&prev_code_len + (long)(int)code.first) = (byte)pVar10.second;
              if (code_len != 0) {
                register0x00000000 =
                     (0x8000 >> ((byte)pVar10.second & 0x1f)) + stack0xfffffffffffffd00;
                repeat_code_len = code_len;
              }
              i_2 = 0;
              code.first = code.first + 1;
            }
            else {
              iVar5 = 3;
              if (code_len == 0x10) {
                iVar5 = 2;
                local_454 = repeat_code_len;
              }
              else {
                local_454 = 0;
              }
              iVar6 = brotli_decoder_state::peek((brotli_decoder_state *)this,iVar5);
              brotli_decoder_state::drop((brotli_decoder_state *)this,iVar5);
              if (code.second != local_454) {
                i_2 = 0;
                code.second = local_454;
              }
              iVar7 = i_2;
              if (0 < i_2) {
                i_2 = i_2 + -2 << (sbyte)iVar5;
              }
              i_2 = iVar6 + 3 + i_2;
              iVar7 = i_2 - iVar7;
              if ((int)uVar4 < (int)(code.first + iVar7)) {
                *(undefined4 *)(this + 0x28) = 4;
                return;
              }
              for (local_43c = 0; local_43c != iVar7; local_43c = local_43c + 1) {
                *(byte *)((long)&prev_code_len + (long)(int)code.first) = (byte)local_454;
                code.first = code.first + 1;
              }
              if (local_454 != 0) {
                register0x00000000 =
                     (0x8000 >> ((byte)local_454 & 0x1f)) * iVar7 + stack0xfffffffffffffd00;
              }
            }
          }
          if (stack0xfffffffffffffd00 < 0x8001) {
            memset((void *)((long)&prev_code_len + (long)(int)code.first),0,
                   (long)(int)(uVar4 - code.first));
            huffman_table<258>::init((huffman_table<258> *)s,(EVP_PKEY_CTX *)&prev_code_len);
            bVar2 = huffman_table<258>::invalid((huffman_table<258> *)s);
            if (bVar2) {
              *(undefined4 *)(this + 0x28) = 4;
            }
          }
          else {
            *(undefined4 *)(this + 0x28) = 4;
          }
        }
      }
      else {
        *(undefined4 *)(this + 0x28) = 4;
      }
    }
  }
  return;
}

Assistant:

static void read_huffman_code(brotli_decoder_state &s, Table &table, int alphabet_size) {
      int code_type = s.read(2);
      if (s.error != error_code::ok) return;
      alphabet_size &= 1023;
      if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->sub_loop_counter = %d\n", code_type);
      if (code_type == 1) {
        // 3.4.  Simple Prefix Codes
        int num_symbols = s.read(2) + 1;
        int alphabet_bits = log2_floor(alphabet_size - 1);
        uint16_t symbols[Table::max_codes];
        for (int i = 0; i != num_symbols; ++i) {
          symbols[i] = (uint16_t)s.read(alphabet_bits);
          if (debug) fprintf(s.log_file, "[ReadSimpleHuffmanSymbols] s->symbols_lists_array[i] = %d\n", symbols[i]);
        }
        if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->symbol = %d\n", num_symbols-1);
        static const uint8_t simple_lengths[][4] = {
          {0},
          {1, 1},
          {1, 2, 2},
          {2, 2, 2, 2},
          {1, 2, 3, 3},
        };
        int tree_select = num_symbols == 4 ? s.read(1) : 0;
        table.init(simple_lengths[num_symbols - 1 + tree_select], symbols, num_symbols);
      } else {
        // 3.5.  Complex Prefix Codes
        andyzip::huffman_table<18> complex_table;
        {
          uint8_t lengths[18] = {0};
          int space = 0;
          int num_codes = 0;
          for (int i = code_type; i != 18; ++i) {
            int bits = s.peek(4);
            if (s.error != error_code::ok) return;

            static const uint8_t kCodeLengthCodeOrder[18] = {
              1, 2, 3, 4, 0, 5, 17, 6, 16, 7, 8, 9, 10, 11, 12, 13, 14, 15,
            };

            // Static prefix code for the complex code length code lengths.
            static const uint8_t kCodeLengthPrefixLength[16] = {
              2, 2, 2, 3, 2, 2, 2, 4, 2, 2, 2, 3, 2, 2, 2, 4,
            };

            static const uint8_t kCodeLengthPrefixValue[16] = {
              0, 4, 3, 2, 0, 4, 3, 1, 0, 4, 3, 2, 0, 4, 3, 5,
            };

            s.drop(kCodeLengthPrefixLength[bits]);
            uint8_t length = kCodeLengthPrefixValue[bits];
            lengths[kCodeLengthCodeOrder[i]] = length;
            if (debug) fprintf(s.log_file, "[ReadCodeLengthCodeLengths] s->code_length_code_lengths[%d] = %d\n", kCodeLengthCodeOrder[i], lengths[kCodeLengthCodeOrder[i]]);
            if (length) {
              ++num_codes;
              space += 32 >> length;
              if (space >= 32) break;
            }
          }
          if (num_codes != 1 && space != 32) {
            if (debug) fprintf(s.log_file, "bad\n");
            s.error = error_code::huffman_length_error;
            return;
          }

          complex_table.init(lengths, nullptr, 18);
          if (complex_table.invalid()) {
            if (debug) fprintf(s.log_file, "bad2\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }

        {
          int space = 0;
          uint8_t lengths[Table::max_codes];
          uint8_t nzcl = 8;
          int prev_code_len = 8;
          int repeat = 0;
          int repeat_code_len = 0;
          int i = 0;
          for(; i < alphabet_size && space < 32768;) {
            auto code = complex_table.decode(s.peek(16));
            s.drop(code.first);
            int code_len = code.second;
            if (code_len < 16) {
              if (code_len) {
                if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d] = %d\n", i, code_len);
              }
              if (i + 1 > alphabet_size) {
                s.error = error_code::huffman_length_error;
                if (debug) fprintf(s.log_file, "bad3\n");
                return;
              }
              lengths[i++] = (uint8_t)code_len;
              if (code_len) {
                space += 32768 >> code_len;
                prev_code_len = code_len;
              }
              repeat = 0;
            } else {
              int extra_bits = code_len == 16 ? 2 : 3;
              int new_len = code_len == 16 ? prev_code_len : 0;
              int repeat_delta = s.peek(extra_bits);
              s.drop(extra_bits);

              if (repeat_code_len != new_len) {
                repeat = 0;
                repeat_code_len = new_len;
              }

              int old_repeat = repeat;
              if (repeat > 0) {
                repeat -= 2;
                repeat <<= extra_bits;
              }

              repeat += repeat_delta + 3;
              repeat_delta = repeat - old_repeat;

              if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d..%d] = %d\n", i, i + repeat_delta - 1, new_len);
              if (i + repeat_delta > alphabet_size) {
                if (debug) fprintf(s.log_file, "bad4 %d %d %d\n", i, repeat_delta, alphabet_size);
                s.error = error_code::huffman_length_error;
                return;
              }
              for (int j = 0; j != repeat_delta; ++j) {
                lengths[i++] = new_len;
              }
              if (new_len) {
                space += (32768 >> new_len) * repeat_delta;
              }
            }
          }
          if (space > 32768) {
            if (debug) fprintf(s.log_file, "bad5\n");
            s.error = error_code::huffman_length_error;
            return;
          }
          memset(lengths + i, 0, alphabet_size - i);
          table.init(lengths, nullptr, alphabet_size);
          if (table.invalid()) {
            if (debug) fprintf(s.log_file, "bad6\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }
      }
    }